

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::CreateAndSetGlobalGenerator(cmake *this,string *name,bool allowArch)

{
  int iVar1;
  long lVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string vsError;
  string kdevError;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_100;
  undefined1 *local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  _Base_ptr local_d8;
  char *local_d0;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  pointer local_78;
  pointer local_70;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  undefined1 *local_40;
  _Alloc_hider local_38;
  
  CreateGlobalGenerator((cmake *)local_98,(string *)this,SUB81(name,0));
  if (local_98 == (undefined1  [8])0x0) {
    local_d0 = (char *)0x0;
    local_c8[0] = _S_red;
    local_f0 = (_Base_ptr)0x0;
    local_e8 = 0;
    local_f8 = &local_e8;
    local_d8 = (_Base_ptr)local_c8;
    lVar2 = std::__cxx11::string::find((char *)name,0x8a1511,0);
    if (lVar2 != -1) {
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x8a151b);
    }
    if (!allowArch) {
      local_90.first._M_str = (name->_M_dataplus)._M_p;
      local_90.first._M_len = name->_M_string_length;
      __str._M_str = "Visual Studio ";
      __str._M_len = 0xe;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_98 + 8),0,0xe,
                         __str);
      if ((iVar1 == 0) && (0x15 < name->_M_string_length)) {
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)local_f0,0x8a155d);
      }
    }
    local_90.first._M_len = 0x21;
    local_90.first._M_str = "Could not create named generator ";
    local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_70 = (pointer)(name->_M_dataplus)._M_p;
    local_78 = (pointer)name->_M_string_length;
    local_68._0_8_ = 0;
    local_68._8_8_ = local_d0;
    local_58 = local_d8;
    local_50 = (_Base_ptr)0x0;
    local_48 = local_f0;
    local_40 = local_f8;
    local_38._M_p = (pointer)0x0;
    views._M_len = 4;
    views._M_array = (iterator)(local_98 + 8);
    cmCatViews((string *)(local_c8 + 0x10),views);
    cmSystemTools::Error((string *)(local_c8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._16_8_ != &local_a8) {
      operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
    }
    PrintGeneratorList(this);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
    }
    if (local_d8 != (_Base_ptr)local_c8) {
      operator_delete(local_d8,CONCAT71(local_c8._1_7_,local_c8[0]) + 1);
    }
  }
  else {
    local_100._M_head_impl = (cmGlobalGenerator *)local_98;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_100);
    if (local_100._M_head_impl != (cmGlobalGenerator *)0x0) {
      (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                   *)&(local_100._M_head_impl)->_vptr_cmGlobalGenerator)->
                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                )._M_t.
                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                _vptr_cmGlobalGeneratorFactory)();
    }
  }
  return local_98 != (undefined1  [8])0x0;
}

Assistant:

bool cmake::CreateAndSetGlobalGenerator(const std::string& name,
                                        bool allowArch)
{
  auto gen = this->CreateGlobalGenerator(name, allowArch);
  if (!gen) {
    std::string kdevError;
    std::string vsError;
    if (name.find("KDevelop3", 0) != std::string::npos) {
      kdevError = "\nThe KDevelop3 generator is not supported anymore.";
    }
    if (!allowArch && cmHasLiteralPrefix(name, "Visual Studio ") &&
        name.length() >= cmStrLen("Visual Studio xx xxxx ")) {
      vsError = "\nUsing platforms in Visual Studio generator names is not "
                "supported in CMakePresets.json.";
    }

    cmSystemTools::Error(
      cmStrCat("Could not create named generator ", name, kdevError, vsError));
    this->PrintGeneratorList();
    return false;
  }

  this->SetGlobalGenerator(std::move(gen));
  return true;
}